

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O2

Blob<128> bitreverse<Blob<128>>(Blob<128> *n,size_t b)

{
  ulong in_RDX;
  undefined8 extraout_RDX;
  undefined8 uVar1;
  undefined8 extraout_RDX_00;
  size_t i;
  ulong uVar2;
  Blob<128> BVar3;
  
  Blob<128>::Blob(n,0);
  uVar1 = extraout_RDX;
  for (uVar2 = 0; uVar2 < in_RDX; uVar2 = uVar2 + 8) {
    Blob<128>::operator<<=(n,8);
    n->bytes[0] = n->bytes[0] |
                  bitrev(unsigned_char)::revbits[*(uint *)b & 0xf] << 4 |
                  bitrev(unsigned_char)::revbits[*(uint *)b >> 4 & 0xf];
    Blob<128>::operator>>=((Blob<128> *)b,8);
    uVar1 = extraout_RDX_00;
  }
  BVar3.bytes[8] = (char)uVar1;
  BVar3.bytes[9] = (char)((ulong)uVar1 >> 8);
  BVar3.bytes[10] = (char)((ulong)uVar1 >> 0x10);
  BVar3.bytes[0xb] = (char)((ulong)uVar1 >> 0x18);
  BVar3.bytes[0xc] = (char)((ulong)uVar1 >> 0x20);
  BVar3.bytes[0xd] = (char)((ulong)uVar1 >> 0x28);
  BVar3.bytes[0xe] = (char)((ulong)uVar1 >> 0x30);
  BVar3.bytes[0xf] = (char)((ulong)uVar1 >> 0x38);
  BVar3.bytes._0_8_ = n;
  return (Blob<128>)BVar3.bytes;
}

Assistant:

hashtype bitreverse(hashtype n, size_t b = sizeof(hashtype) * 8)
{
    assert(b <= std::numeric_limits<hashtype>::digits);
    hashtype rv = 0;
    for (size_t i = 0; i < b; i += 8) {
        rv <<= 8;
        rv |= bitrev(n & 0xff); // ensure overloaded |= op for Blob not underflowing
        n >>= 8;
    }
    return rv;
}